

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O2

uint * Kit_TruthIsop_rec(uint *puOn,uint *puOnDc,int nVars,Kit_Sop_t *pcRes,Vec_Int_t *vStore)

{
  uint *pOut;
  int *piVar1;
  int iVar2;
  uint *pOut_00;
  uint *puVar3;
  uint *pIn1;
  uint *pIn1_00;
  uint *puVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint nVars_00;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  Kit_Sop_t cRes0;
  Kit_Sop_t cRes2;
  Kit_Sop_t cRes1;
  
  uVar12 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar12 = 1;
  }
  pOut_00 = Vec_IntFetch(vStore,(uint)uVar12);
  uVar6 = uVar12;
  if (pOut_00 != (uint *)0x0) {
    do {
      if ((long)uVar6 < 1) {
        pcRes->nLits = 0;
        pcRes->nCubes = 0;
        pcRes->pCubes = (uint *)0x0;
        for (; 0 < (long)uVar12; uVar12 = uVar12 - 1) {
          pOut_00[uVar12 - 1] = 0;
        }
        return pOut_00;
      }
      lVar11 = uVar6 - 1;
      uVar7 = uVar12;
      uVar6 = uVar6 - 1;
    } while (puOn[lVar11] == 0);
    do {
      if ((long)uVar7 < 1) {
        pcRes->nLits = 0;
        pcRes->nCubes = 1;
        iVar9 = vStore->nSize;
        vStore->nSize = iVar9 + 1;
        if (iVar9 < vStore->nCap) {
          piVar1 = vStore->pArray;
          pcRes->pCubes = (uint *)(piVar1 + iVar9);
          piVar1[iVar9] = 0;
          for (; 0 < (long)uVar12; uVar12 = uVar12 - 1) {
            pOut_00[uVar12 - 1] = 0xffffffff;
          }
          return pOut_00;
        }
        pcRes->pCubes = (uint *)0x0;
        goto LAB_004cae0f;
      }
      lVar11 = uVar7 - 1;
      uVar7 = uVar7 - 1;
    } while (puOnDc[lVar11] == 0xffffffff);
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitIsop.c"
                    ,0x107,
                    "unsigned int *Kit_TruthIsop_rec(unsigned int *, unsigned int *, int, Kit_Sop_t *, Vec_Int_t *)"
                   );
    }
    iVar9 = nVars * 2;
    uVar10 = nVars;
    do {
      nVars_00 = uVar10;
      iVar9 = iVar9 + -2;
      if ((int)nVars_00 < 1) {
        __assert_fail("Var >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitIsop.c"
                      ,0x10d,
                      "unsigned int *Kit_TruthIsop_rec(unsigned int *, unsigned int *, int, Kit_Sop_t *, Vec_Int_t *)"
                     );
      }
      uVar10 = nVars_00 - 1;
      iVar2 = Kit_TruthVarInSupport(puOn,nVars,uVar10);
    } while ((iVar2 == 0) && (iVar2 = Kit_TruthVarInSupport(puOnDc,nVars,uVar10), iVar2 == 0));
    if (nVars_00 < 6) {
      uVar10 = Kit_TruthIsop5_rec(*puOn,*puOnDc,nVars_00,pcRes,vStore);
      for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
        pOut_00[uVar6] = uVar10;
      }
      return pOut_00;
    }
    bVar5 = (char)nVars_00 - 6;
    uVar6 = (ulong)(uint)(1 << (bVar5 & 0x1f));
    Kit_TruthSharp(pOut_00,puOn,puOnDc + uVar6,uVar10);
    puVar3 = Kit_TruthIsop_rec(pOut_00,puOnDc,uVar10,&cRes0,vStore);
    if (cRes0.nCubes != -1) {
      pOut = pOut_00 + uVar6;
      Kit_TruthSharp(pOut,puOn + uVar6,puOnDc,uVar10);
      pIn1 = Kit_TruthIsop_rec(pOut,puOnDc + uVar6,uVar10,&cRes1,vStore);
      if (cRes1.nCubes != -1) {
        Kit_TruthSharp(pOut_00,puOn,puVar3,uVar10);
        Kit_TruthSharp(pOut,puOn + uVar6,pIn1,uVar10);
        Kit_TruthOr(pOut_00,pOut_00,pOut,uVar10);
        for (lVar11 = 0; 0 < (long)(uVar6 + lVar11); lVar11 = lVar11 + -1) {
          pOut_00[uVar6 * 2 + lVar11 + -1] =
               puOnDc[uVar6 * 2 + lVar11 + -1] & puOnDc[uVar6 + lVar11 + -1];
        }
        pIn1_00 = Kit_TruthIsop_rec(pOut_00,pOut,uVar10,&cRes2,vStore);
        if (cRes2.nCubes != -1) {
          pcRes->nLits = cRes0.nLits + cRes1.nCubes + cRes0.nCubes + cRes1.nLits + cRes2.nLits;
          iVar2 = cRes1.nCubes + cRes0.nCubes + cRes2.nCubes;
          pcRes->nCubes = iVar2;
          puVar4 = Vec_IntFetch(vStore,iVar2);
          pcRes->pCubes = puVar4;
          if (puVar4 != (uint *)0x0) {
            uVar7 = 0;
            uVar6 = (ulong)(uint)cRes0.nCubes;
            if (cRes0.nCubes < 1) {
              uVar6 = uVar7;
            }
            for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
              puVar4[uVar7] = cRes0.pCubes[uVar7] | 1 << ((byte)iVar9 & 0x1f);
            }
            uVar8 = 0;
            uVar7 = (ulong)(uint)cRes1.nCubes;
            if (cRes1.nCubes < 1) {
              uVar7 = uVar8;
            }
            puVar4 = puVar4 + uVar6;
            for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
              *puVar4 = cRes1.pCubes[uVar8] | 2 << ((byte)iVar9 & 0x1f);
              puVar4 = puVar4 + 1;
            }
            iVar9 = 0;
            if (cRes2.nCubes < 1) {
              cRes2.nCubes = 0;
            }
            for (uVar7 = 0; (uint)cRes2.nCubes != uVar7; uVar7 = uVar7 + 1) {
              *puVar4 = cRes2.pCubes[uVar7];
              puVar4 = puVar4 + 1;
              iVar9 = iVar9 + -1;
            }
            if ((iVar9 + pcRes->nCubes) - (int)uVar6 == (int)uVar8) {
              Kit_TruthOr(pOut_00,puVar3,pIn1_00,uVar10);
              Kit_TruthOr(pOut,pIn1,pIn1_00,uVar10);
              bVar5 = bVar5 & 0x1f;
              uVar10 = 2 << bVar5;
              uVar6 = 0;
              if (0 < 2 << bVar5) {
                uVar6 = (ulong)uVar10;
              }
              puVar3 = pOut_00;
              for (uVar7 = 1; puVar3 = puVar3 + (int)uVar10,
                  uVar7 < (uint)uVar12 >> ((char)nVars_00 - 5U & 0x1f); uVar7 = uVar7 + 1) {
                for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
                  puVar3[uVar8] = pOut_00[uVar8];
                }
              }
              return pOut_00;
            }
            __assert_fail("k == pcRes->nCubes",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitIsop.c"
                          ,0x145,
                          "unsigned int *Kit_TruthIsop_rec(unsigned int *, unsigned int *, int, Kit_Sop_t *, Vec_Int_t *)"
                         );
          }
        }
      }
    }
  }
LAB_004cae0f:
  pcRes->nCubes = -1;
  return (uint *)0x0;
}

Assistant:

unsigned * Kit_TruthIsop_rec( unsigned * puOn, unsigned * puOnDc, int nVars, Kit_Sop_t * pcRes, Vec_Int_t * vStore )
{
    Kit_Sop_t cRes0, cRes1, cRes2;
    Kit_Sop_t * pcRes0 = &cRes0, * pcRes1 = &cRes1, * pcRes2 = &cRes2;
    unsigned * puRes0, * puRes1, * puRes2;
    unsigned * puOn0, * puOn1, * puOnDc0, * puOnDc1, * pTemp, * pTemp0, * pTemp1;
    int i, k, Var, nWords, nWordsAll;
//    assert( Kit_TruthIsImply( puOn, puOnDc, nVars ) );
    // allocate room for the resulting truth table
    nWordsAll = Kit_TruthWordNum( nVars );
    pTemp = Vec_IntFetch( vStore, nWordsAll );
    if ( pTemp == NULL )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    // check for constants
    if ( Kit_TruthIsConst0( puOn, nVars ) )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 0;
        pcRes->pCubes = NULL;
        Kit_TruthClear( pTemp, nVars );
        return pTemp;
    }
    if ( Kit_TruthIsConst1( puOnDc, nVars ) )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 1;
        pcRes->pCubes = Vec_IntFetch( vStore, 1 );
        if ( pcRes->pCubes == NULL )
        {
            pcRes->nCubes = -1;
            return NULL;
        }
        pcRes->pCubes[0] = 0;
        Kit_TruthFill( pTemp, nVars );
        return pTemp;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Kit_TruthVarInSupport( puOn, nVars, Var ) || 
             Kit_TruthVarInSupport( puOnDc, nVars, Var ) )
             break;
    assert( Var >= 0 );
    // consider a simple case when one-word computation can be used
    if ( Var < 5 )
    {
        unsigned uRes = Kit_TruthIsop5_rec( puOn[0], puOnDc[0], Var+1, pcRes, vStore );
        for ( i = 0; i < nWordsAll; i++ )
            pTemp[i] = uRes;
        return pTemp;
    }
    assert( Var >= 5 );
    nWords = Kit_TruthWordNum( Var );
    // cofactor
    puOn0   = puOn;    puOn1   = puOn + nWords;
    puOnDc0 = puOnDc;  puOnDc1 = puOnDc + nWords;
    pTemp0  = pTemp;   pTemp1  = pTemp + nWords;
    // solve for cofactors
    Kit_TruthSharp( pTemp0, puOn0, puOnDc1, Var );
    puRes0 = Kit_TruthIsop_rec( pTemp0, puOnDc0, Var, pcRes0, vStore );
    if ( pcRes0->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    Kit_TruthSharp( pTemp1, puOn1, puOnDc0, Var );
    puRes1 = Kit_TruthIsop_rec( pTemp1, puOnDc1, Var, pcRes1, vStore );
    if ( pcRes1->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    Kit_TruthSharp( pTemp0, puOn0, puRes0, Var );
    Kit_TruthSharp( pTemp1, puOn1, puRes1, Var );
    Kit_TruthOr( pTemp0, pTemp0, pTemp1, Var );
    Kit_TruthAnd( pTemp1, puOnDc0, puOnDc1, Var );
    puRes2 = Kit_TruthIsop_rec( pTemp0, pTemp1, Var, pcRes2, vStore );
    if ( pcRes2->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    // create the resulting cover
    pcRes->nLits  = pcRes0->nLits  + pcRes1->nLits  + pcRes2->nLits + pcRes0->nCubes + pcRes1->nCubes;
    pcRes->nCubes = pcRes0->nCubes + pcRes1->nCubes + pcRes2->nCubes;
    pcRes->pCubes = Vec_IntFetch( vStore, pcRes->nCubes );
    if ( pcRes->pCubes == NULL )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    k = 0;
    for ( i = 0; i < pcRes0->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes0->pCubes[i] | (1 << ((Var<<1)+0));
    for ( i = 0; i < pcRes1->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes1->pCubes[i] | (1 << ((Var<<1)+1));
    for ( i = 0; i < pcRes2->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes2->pCubes[i];
    assert( k == pcRes->nCubes );
    // create the resulting truth table
    Kit_TruthOr( pTemp0, puRes0, puRes2, Var );
    Kit_TruthOr( pTemp1, puRes1, puRes2, Var );
    // copy the table if needed
    nWords <<= 1;
    for ( i = 1; i < nWordsAll/nWords; i++ )
        for ( k = 0; k < nWords; k++ )
            pTemp[i*nWords + k] = pTemp[k];
    // verify in the end
//    assert( Kit_TruthIsImply( puOn, pTemp, nVars ) );
//    assert( Kit_TruthIsImply( pTemp, puOnDc, nVars ) );
    return pTemp;
}